

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::PortSymbol::serializeTo(PortSymbol *this,ASTSerializer *serializer)

{
  Type *__n;
  Expression *__n_00;
  string_view sVar1;
  
  __n = getType(this);
  ASTSerializer::write(serializer,4,"type",(size_t)__n);
  sVar1 = ast::toString(this->direction);
  ASTSerializer::write(serializer,9,"direction",sVar1._M_len);
  if (this->isNullPort == true) {
    ASTSerializer::write(serializer,10,"isNullPort",1);
  }
  __n_00 = getInitializer(this);
  if (__n_00 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xb,"initializer",(size_t)__n_00);
  }
  if (this->internalSymbol != (Symbol *)0x0) {
    sVar1._M_str = "internalSymbol";
    sVar1._M_len = 0xe;
    ASTSerializer::writeLink(serializer,sVar1,this->internalSymbol);
    return;
  }
  return;
}

Assistant:

void PortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("type", getType());
    serializer.write("direction", toString(direction));

    if (isNullPort)
        serializer.write("isNullPort", isNullPort);

    if (auto init = getInitializer())
        serializer.write("initializer", *init);

    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
}